

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConstraintItemSyntax * __thiscall
slang::parsing::Parser::parseConstraintItem(Parser *this,bool allowBlock,bool isTopLevel)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token before_00;
  Token soft_00;
  Token foreachKeyword;
  Token elseKeyword_00;
  Token openParen_00;
  Token semi_00;
  Token semi_01;
  Token arrow_00;
  Token semi_02;
  Token solve_00;
  Token disable_00;
  Token ifKeyword_00;
  Token unique;
  Token soft_01;
  Token soft_02;
  SourceRange range;
  Token semi_03;
  Token closeParen_00;
  Token semi_04;
  Token TVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  SolveBeforeConstraintSyntax *pSVar5;
  DisableConstraintSyntax *pDVar6;
  LoopConstraintSyntax *pLVar7;
  ConditionalConstraintSyntax *pCVar8;
  UniquenessConstraintSyntax *pUVar9;
  ExpressionConstraintSyntax *pEVar10;
  ConstraintBlockSyntax *pCVar11;
  Info *pIVar12;
  undefined8 *puVar13;
  byte bVar14;
  byte in_DL;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  byte in_SIL;
  undefined8 *in_RDI;
  Token TVar15;
  Token arrow;
  ExpressionSyntax *expr;
  Token curr;
  uint32_t index;
  ExpressionSyntax *exprOrDist;
  Token soft_1;
  RangeListSyntax *list;
  Token keyword_1;
  Token elseKeyword;
  ElseConstraintClauseSyntax *elseClause;
  ConstraintItemSyntax *constraints;
  Token closeParen;
  ExpressionSyntax *condition;
  Token openParen;
  Token ifKeyword;
  ForeachLoopListSyntax *vars;
  Token keyword;
  ExpressionSyntax *name;
  Token soft;
  Token disable;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> afterBuffer;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> beforeBuffer;
  Token before;
  Token solve;
  ParserBase *in_stack_fffffffffffffa88;
  Parser *in_stack_fffffffffffffa90;
  Token *this_00;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *this_01;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 uVar16;
  undefined2 in_stack_fffffffffffffa9c;
  TokenKind in_stack_fffffffffffffa9e;
  undefined4 in_stack_fffffffffffffaa0;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffaa8;
  TokenKind in_stack_fffffffffffffaac;
  undefined2 uVar17;
  TokenKind in_stack_fffffffffffffaae;
  undefined2 uVar18;
  SourceLocation in_stack_fffffffffffffab0;
  SourceLocation in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  DiagCode in_stack_fffffffffffffac4;
  undefined5 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacd;
  undefined1 in_stack_ffffffffffffface;
  byte bVar19;
  undefined1 in_stack_fffffffffffffacf;
  Info *in_stack_fffffffffffffad0;
  ElseConstraintClauseSyntax *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffb18;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb38;
  undefined1 isTopLevel_00;
  Parser *in_stack_fffffffffffffb40;
  undefined6 in_stack_fffffffffffffb68;
  TokenKind TVar20;
  undefined1 in_stack_fffffffffffffba0 [16];
  undefined1 auVar21 [12];
  Token in_stack_fffffffffffffbb0;
  undefined1 auVar22 [12];
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  Parser *this_02;
  Token in_stack_fffffffffffffbd0;
  AllowEmpty in_stack_fffffffffffffbe0;
  TokenKind local_410;
  bitmask<slang::parsing::detail::ExpressionOptions> local_3d4;
  ExpressionSyntax *local_3d0;
  Token local_3c8;
  Token local_3b8;
  undefined8 local_3a8;
  Info *local_3a0;
  RangeListSyntax *local_398;
  Token local_390;
  ExpressionSyntax *local_380;
  Info *local_378;
  undefined8 local_370;
  Info *local_368;
  undefined8 local_360;
  Info *local_358;
  undefined8 local_350;
  Info *local_348;
  Token local_340;
  ElseConstraintClauseSyntax *local_330;
  ConstraintItemSyntax *local_328;
  Token local_320;
  ExpressionSyntax *local_310;
  Token local_308;
  Token local_2f8;
  undefined8 local_2e8;
  Info *local_2e0;
  ForeachLoopListSyntax *local_2d8;
  undefined8 local_2d0;
  undefined1 in_stack_fffffffffffffd40 [16];
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_240;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f0;
  undefined8 local_1a8;
  Info *pIStack_1a0;
  undefined1 local_198 [136];
  SyntaxFactory *local_110;
  undefined8 uStack_108;
  Token local_f0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_e0 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  SourceRange local_58;
  undefined4 local_44;
  Token local_40;
  TokenKind local_30;
  bool isTopLevel_01;
  bool allowBlock_00;
  undefined6 in_stack_ffffffffffffffe0;
  ExpressionConstraintSyntax *local_10;
  
  auVar22 = in_stack_fffffffffffffbb0._4_12_;
  kind = (TokenKind)((ulong)in_stack_fffffffffffffb18 >> 0x30);
  auVar21 = in_stack_fffffffffffffba0._4_12_;
  isTopLevel_00 = (undefined1)((ulong)in_stack_fffffffffffffb38 >> 0x38);
  bVar14 = in_SIL & 1;
  bVar2 = in_DL & 1;
  _local_30 = ParserBase::peek(in_stack_fffffffffffffa88);
  this_02 = in_stack_fffffffffffffbd0._0_8_;
  if (local_30 == OpenBrace) {
    if ((bVar14 & 1) != 0) {
      TVar15 = ParserBase::peek((ParserBase *)
                                CONCAT26(in_stack_fffffffffffffa9e,
                                         CONCAT24(in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98)),
                                (uint32_t)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      local_410 = TVar15.kind;
      bVar19 = 1;
      if (local_410 != CloseBrace) {
        bVar3 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInConcatenationExpr>
                          ((Parser *)in_stack_fffffffffffffab8,(uint32_t *)in_stack_fffffffffffffab0
                           ,in_stack_fffffffffffffaae,in_stack_fffffffffffffaac);
        bVar19 = bVar3 ^ 0xff;
      }
      if ((bVar19 & 1) != 0) {
        pCVar11 = parseConstraintBlock(in_stack_fffffffffffffb40,(bool)isTopLevel_00);
        return &pCVar11->super_ConstraintItemSyntax;
      }
    }
  }
  else {
    if (local_30 == DisableKeyword) {
      ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
      ParserBase::expect(in_stack_fffffffffffffb20,kind);
      parseExpression(in_stack_fffffffffffffa90);
      TVar15 = ParserBase::expect(in_stack_fffffffffffffb20,kind);
      disable_00.rawLen._0_2_ = in_stack_fffffffffffffaac;
      disable_00.kind = (short)in_stack_fffffffffffffaa8;
      disable_00._2_1_ = (char)((uint)in_stack_fffffffffffffaa8 >> 0x10);
      disable_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffaa8 >> 0x18);
      disable_00.rawLen._2_2_ = in_stack_fffffffffffffaae;
      disable_00.info = (Info *)in_stack_fffffffffffffab0;
      soft_00.rawLen._0_2_ = in_stack_fffffffffffffa9c;
      soft_00.kind = (short)in_stack_fffffffffffffa98;
      soft_00._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
      soft_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
      soft_00.rawLen._2_2_ = in_stack_fffffffffffffa9e;
      soft_00.info._0_4_ = in_stack_fffffffffffffaa0;
      soft_00.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      semi_03.rawLen._0_2_ = in_stack_fffffffffffffac4.subsystem;
      semi_03.rawLen._2_2_ = in_stack_fffffffffffffac4.code;
      semi_03.kind = (short)in_stack_fffffffffffffac0;
      semi_03._2_1_ = (char)((uint)in_stack_fffffffffffffac0 >> 0x10);
      semi_03.numFlags.raw = (char)((uint)in_stack_fffffffffffffac0 >> 0x18);
      semi_03.info._0_5_ = in_stack_fffffffffffffac8;
      semi_03.info._5_1_ = in_stack_fffffffffffffacd;
      semi_03.info._6_1_ = in_stack_ffffffffffffface;
      semi_03.info._7_1_ = in_stack_fffffffffffffacf;
      pDVar6 = slang::syntax::SyntaxFactory::disableConstraint
                         ((SyntaxFactory *)TVar15.info,disable_00,soft_00,TVar15._0_8_,semi_03);
      return &pDVar6->super_ConstraintItemSyntax;
    }
    if (local_30 == ForeachKeyword) {
      _local_2d0 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
      local_2d8 = parseForeachLoopVariables(this_02);
      local_2e8 = local_2d0;
      local_2e0 = local_2d0._8_8_;
      parseConstraintItem((Parser *)CONCAT17(bVar14,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                          allowBlock_00,isTopLevel_01);
      foreachKeyword.rawLen._0_2_ = in_stack_fffffffffffffa9c;
      foreachKeyword.kind = (short)in_stack_fffffffffffffa98;
      foreachKeyword._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
      foreachKeyword.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
      foreachKeyword.rawLen._2_2_ = in_stack_fffffffffffffa9e;
      foreachKeyword.info._0_4_ = in_stack_fffffffffffffaa0;
      foreachKeyword.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      pLVar7 = slang::syntax::SyntaxFactory::loopConstraint
                         ((SyntaxFactory *)in_stack_fffffffffffffa90,foreachKeyword,
                          (ForeachLoopListSyntax *)in_stack_fffffffffffffa88,
                          (ConstraintItemSyntax *)0x313a76);
      return &pLVar7->super_ConstraintItemSyntax;
    }
    if (local_30 == IfKeyword) {
      local_2f8 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
      local_308 = ParserBase::expect(in_stack_fffffffffffffb20,kind);
      local_310 = parseExpression(in_stack_fffffffffffffa90);
      local_320 = ParserBase::expect(in_stack_fffffffffffffb20,kind);
      local_328 = parseConstraintItem((Parser *)
                                      CONCAT17(bVar14,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                                      allowBlock_00,isTopLevel_01);
      local_330 = (ElseConstraintClauseSyntax *)0x0;
      bVar3 = ParserBase::peek((ParserBase *)
                               CONCAT44(in_stack_fffffffffffffaa4.m_bits,in_stack_fffffffffffffaa0),
                               in_stack_fffffffffffffa9e);
      if (bVar3) {
        TVar15 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
        local_340._0_8_ = TVar15._0_8_;
        local_350._0_2_ = local_340.kind;
        local_350._2_1_ = local_340._2_1_;
        local_350._3_1_ = local_340.numFlags.raw;
        local_350._4_4_ = local_340.rawLen;
        local_340.info = TVar15.info;
        local_348 = local_340.info;
        local_340 = TVar15;
        parseConstraintItem((Parser *)CONCAT17(bVar14,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                            allowBlock_00,isTopLevel_01);
        elseKeyword_00.rawLen._0_2_ = in_stack_fffffffffffffa9c;
        elseKeyword_00.kind = (short)in_stack_fffffffffffffa98;
        elseKeyword_00._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
        elseKeyword_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
        elseKeyword_00.rawLen._2_2_ = in_stack_fffffffffffffa9e;
        elseKeyword_00.info._0_4_ = in_stack_fffffffffffffaa0;
        elseKeyword_00.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
        local_330 = slang::syntax::SyntaxFactory::elseConstraintClause
                              ((SyntaxFactory *)in_stack_fffffffffffffa90,elseKeyword_00,
                               (ConstraintItemSyntax *)in_stack_fffffffffffffa88);
      }
      TVar1 = local_2f8;
      TVar15 = local_308;
      local_360._0_2_ = local_2f8.kind;
      local_360._2_1_ = local_2f8._2_1_;
      local_360._3_1_ = local_2f8.numFlags.raw;
      local_360._4_4_ = local_2f8.rawLen;
      local_2f8.info = TVar1.info;
      local_358 = local_2f8.info;
      local_370._0_2_ = local_308.kind;
      local_370._2_1_ = local_308._2_1_;
      local_370._3_1_ = local_308.numFlags.raw;
      local_370._4_4_ = local_308.rawLen;
      local_308.info = TVar15.info;
      local_368 = local_308.info;
      local_380 = (ExpressionSyntax *)local_320._0_8_;
      local_378 = local_320.info;
      ifKeyword_00.rawLen._0_2_ = in_stack_fffffffffffffaac;
      ifKeyword_00.kind = (short)in_stack_fffffffffffffaa8;
      ifKeyword_00._2_1_ = (char)((uint)in_stack_fffffffffffffaa8 >> 0x10);
      ifKeyword_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffaa8 >> 0x18);
      ifKeyword_00.rawLen._2_2_ = in_stack_fffffffffffffaae;
      ifKeyword_00.info = (Info *)in_stack_fffffffffffffab0;
      openParen_00.info._0_4_ = (int)local_330;
      openParen_00._0_8_ = local_328;
      openParen_00.info._4_4_ = (int)((ulong)local_330 >> 0x20);
      closeParen_00.rawLen._0_2_ = in_stack_fffffffffffffac4.subsystem;
      closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffac4.code;
      closeParen_00.kind = (short)in_stack_fffffffffffffac0;
      closeParen_00._2_1_ = (char)((uint)in_stack_fffffffffffffac0 >> 0x10);
      closeParen_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffac0 >> 0x18);
      closeParen_00.info._0_5_ = in_stack_fffffffffffffac8;
      closeParen_00.info._5_1_ = in_stack_fffffffffffffacd;
      closeParen_00.info._6_1_ = in_stack_ffffffffffffface;
      closeParen_00.info._7_1_ = in_stack_fffffffffffffacf;
      local_308 = TVar15;
      local_2f8 = TVar1;
      pCVar8 = slang::syntax::SyntaxFactory::conditionalConstraint
                         ((SyntaxFactory *)local_320.info,ifKeyword_00,openParen_00,
                          (ExpressionSyntax *)local_320._0_8_,closeParen_00,
                          (ConstraintItemSyntax *)in_stack_fffffffffffffad0,
                          in_stack_fffffffffffffad8);
      return &pCVar8->super_ConstraintItemSyntax;
    }
    if (local_30 == SoftKeyword) {
      local_3c8 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
      memset(&local_3d4,0,4);
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_3d4);
      local_3d0 = parseExpressionOrDist
                            ((Parser *)
                             CONCAT26(in_stack_fffffffffffffa9e,
                                      CONCAT24(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
                             ,in_stack_fffffffffffffaa4);
      ParserBase::expect(in_stack_fffffffffffffb20,kind);
      soft_01.rawLen._0_2_ = in_stack_fffffffffffffaac;
      soft_01.kind = (short)in_stack_fffffffffffffaa8;
      soft_01._2_1_ = (char)((uint)in_stack_fffffffffffffaa8 >> 0x10);
      soft_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffaa8 >> 0x18);
      soft_01.rawLen._2_2_ = in_stack_fffffffffffffaae;
      soft_01.info = (Info *)in_stack_fffffffffffffab0;
      semi_01.rawLen._0_2_ = in_stack_fffffffffffffa9c;
      semi_01.kind = (short)in_stack_fffffffffffffa98;
      semi_01._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
      semi_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
      semi_01.rawLen._2_2_ = in_stack_fffffffffffffa9e;
      semi_01.info._0_4_ = in_stack_fffffffffffffaa0;
      semi_01.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      pEVar10 = slang::syntax::SyntaxFactory::expressionConstraint
                          ((SyntaxFactory *)in_stack_fffffffffffffa90,soft_01,
                           (ExpressionSyntax *)in_stack_fffffffffffffa88,semi_01);
      return &pEVar10->super_ConstraintItemSyntax;
    }
    if (local_30 == SolveKeyword) {
      local_40 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
      if ((bVar2 & 1) == 0) {
        local_44 = 0xa20005;
        local_58 = Token::range((Token *)in_stack_fffffffffffffab0);
        range.endLoc = in_stack_fffffffffffffab8;
        range.startLoc = in_stack_fffffffffffffab0;
        ParserBase::addDiag((ParserBase *)
                            CONCAT26(in_stack_fffffffffffffaae,
                                     CONCAT24(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)),
                            in_stack_fffffffffffffac4,range);
      }
      Token::Token((Token *)in_stack_fffffffffffffa90);
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x3135d7);
      local_f0.info._4_4_ = 0x10001;
      this_00 = &local_f0;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon,slang::parsing::Parser::parseConstraintItem(bool,bool)::__0>
                ((ParserBase *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 auVar22._4_8_,auVar22._2_2_,auVar22._0_2_,auVar21._4_8_,auVar21._0_4_,
                 in_stack_fffffffffffffbd0._0_4_,
                 (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbd0.info,in_stack_fffffffffffffbe0
                );
      Token::Token(this_00);
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x31365c);
      local_198._12_4_ = 0x10001;
      this_01 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_198;
      uVar16 = 0;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseConstraintItem(bool,bool)::__1>
                ((ParserBase *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 auVar22._4_8_,auVar22._2_2_,auVar22._0_2_,auVar21._4_8_,auVar21._0_4_,
                 in_stack_fffffffffffffbd0._0_4_,
                 (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbd0.info,in_stack_fffffffffffffbe0
                );
      TVar15 = local_40;
      local_1a8._0_2_ = local_40.kind;
      local_1a8._2_1_ = local_40._2_1_;
      local_1a8._3_1_ = local_40.numFlags.raw;
      local_1a8._4_4_ = local_40.rawLen;
      pIStack_1a0 = local_40.info;
      local_40 = TVar15;
      iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        (local_e0,(EVP_PKEY_CTX *)*in_RDI,src);
      local_1f0 = CONCAT44(extraout_var,iVar4);
      elements._M_ptr._4_2_ = in_stack_fffffffffffffa9c;
      elements._M_ptr._0_4_ = uVar16;
      elements._M_ptr._6_2_ = in_stack_fffffffffffffa9e;
      elements._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffaa0;
      elements._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
                (this_01,elements);
      local_208 = local_68;
      uStack_200 = uStack_60;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_198 + 0x10),
                 (EVP_PKEY_CTX *)*in_RDI,src_00);
      elements_00._M_ptr._4_2_ = in_stack_fffffffffffffa9c;
      elements_00._M_ptr._0_4_ = uVar16;
      elements_00._M_ptr._6_2_ = in_stack_fffffffffffffa9e;
      elements_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffaa0;
      elements_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
                (this_01,elements_00);
      solve_00.rawLen._0_2_ = in_stack_fffffffffffffaac;
      solve_00.kind = (short)in_stack_fffffffffffffaa8;
      solve_00._2_1_ = (char)((uint)in_stack_fffffffffffffaa8 >> 0x10);
      solve_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffaa8 >> 0x18);
      solve_00.rawLen._2_2_ = in_stack_fffffffffffffaae;
      solve_00.info = (Info *)in_stack_fffffffffffffab0;
      before_00.info._0_4_ = in_stack_fffffffffffffaa0;
      before_00.kind = (undefined2)uStack_108;
      before_00._2_1_ = uStack_108._2_1_;
      before_00.numFlags.raw = uStack_108._3_1_;
      before_00.rawLen = uStack_108._4_4_;
      before_00.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      semi_04.rawLen._1_1_ = in_stack_fffffffffffffacd;
      semi_04._0_5_ = in_stack_fffffffffffffac8;
      semi_04.rawLen._2_1_ = in_stack_ffffffffffffface;
      semi_04.rawLen._3_1_ = in_stack_fffffffffffffacf;
      semi_04.info = in_stack_fffffffffffffad0;
      pSVar5 = slang::syntax::SyntaxFactory::solveBeforeConstraint
                         (local_110,solve_00,&local_240,before_00,
                          (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                          CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),semi_04);
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x313847);
      SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x313854);
      return &pSVar5->super_ConstraintItemSyntax;
    }
    if (local_30 == UniqueKeyword) {
      TVar20 = local_30;
      local_390 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
      local_398 = parseRangeList((Parser *)CONCAT26(TVar20,in_stack_fffffffffffffb68));
      TVar15 = local_390;
      local_3a8._0_2_ = local_390.kind;
      local_3a8._2_1_ = local_390._2_1_;
      local_3a8._3_1_ = local_390.numFlags.raw;
      local_3a8._4_4_ = local_390.rawLen;
      local_390.info = TVar15.info;
      local_3a0 = local_390.info;
      local_390 = TVar15;
      local_3b8 = ParserBase::expect(in_stack_fffffffffffffb20,kind);
      unique.rawLen._0_2_ = in_stack_fffffffffffffaac;
      unique.kind = (short)in_stack_fffffffffffffaa8;
      unique._2_1_ = (char)((uint)in_stack_fffffffffffffaa8 >> 0x10);
      unique.numFlags.raw = (char)((uint)in_stack_fffffffffffffaa8 >> 0x18);
      unique.rawLen._2_2_ = in_stack_fffffffffffffaae;
      unique.info = (Info *)in_stack_fffffffffffffab0;
      semi_00.rawLen._0_2_ = in_stack_fffffffffffffa9c;
      semi_00.kind = (short)in_stack_fffffffffffffa98;
      semi_00._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
      semi_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
      semi_00.rawLen._2_2_ = in_stack_fffffffffffffa9e;
      semi_00.info._0_4_ = in_stack_fffffffffffffaa0;
      semi_00.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
      pUVar9 = slang::syntax::SyntaxFactory::uniquenessConstraint
                         ((SyntaxFactory *)in_stack_fffffffffffffa90,unique,
                          (RangeListSyntax *)in_stack_fffffffffffffa88,semi_00);
      return &pUVar9->super_ConstraintItemSyntax;
    }
  }
  ParserBase::peek(in_stack_fffffffffffffa88);
  bVar3 = slang::syntax::SyntaxFacts::isPossibleExpression
                    ((TokenKind)((ulong)in_stack_fffffffffffffa90 >> 0x20));
  bVar19 = 0;
  if (!bVar3) {
    bVar19 = bVar14 ^ 0xff;
  }
  if ((bVar19 & 1) == 0) {
    ParserBase::peek(in_stack_fffffffffffffa88);
    detail::operator|((ExpressionOptions)in_stack_fffffffffffffa90,
                      (ExpressionOptions)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    pIVar12 = (Info *)parseSubExpression(in_stack_fffffffffffffd40._0_8_,
                                         (bitmask<slang::parsing::detail::ExpressionOptions>)
                                         in_stack_fffffffffffffd40._12_4_,iVar4);
    bVar3 = false;
    if ((bVar14 & 1) == 0) {
      ParserBase::peek(in_stack_fffffffffffffa88);
      bVar3 = Token::operator==((Token *)&stack0xfffffffffffffbd0,(Token *)&stack0xfffffffffffffbb0)
      ;
    }
    if (bVar3 == false) {
      bVar3 = ParserBase::peek((ParserBase *)
                               CONCAT44(in_stack_fffffffffffffaa4.m_bits,in_stack_fffffffffffffaa0),
                               in_stack_fffffffffffffa9e);
      if (bVar3) {
        ParserBase::consume((ParserBase *)in_stack_fffffffffffffab0);
        parseConstraintItem((Parser *)CONCAT17(bVar14,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                            allowBlock_00,isTopLevel_01);
        arrow_00.rawLen._0_2_ = in_stack_fffffffffffffa9c;
        arrow_00.kind = (short)in_stack_fffffffffffffa98;
        arrow_00._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
        arrow_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
        arrow_00.rawLen._2_2_ = in_stack_fffffffffffffa9e;
        arrow_00.info._0_4_ = in_stack_fffffffffffffaa0;
        arrow_00.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
        local_10 = (ExpressionConstraintSyntax *)
                   slang::syntax::SyntaxFactory::implicationConstraint
                             ((SyntaxFactory *)in_stack_fffffffffffffa90,
                              (ExpressionSyntax *)in_stack_fffffffffffffa88,arrow_00,
                              (ConstraintItemSyntax *)0x3140b0);
      }
      else {
        puVar13 = in_RDI + 0x1c;
        uVar16 = SUB84(puVar13,0);
        uVar17 = (undefined2)((ulong)puVar13 >> 0x20);
        uVar18 = (undefined2)((ulong)puVar13 >> 0x30);
        Token::Token((Token *)in_stack_fffffffffffffa90);
        ParserBase::expect(in_stack_fffffffffffffb20,kind);
        soft_02.rawLen._0_2_ = uVar17;
        soft_02.kind = (short)uVar16;
        soft_02._2_1_ = (char)((uint)uVar16 >> 0x10);
        soft_02.numFlags.raw = (char)((uint)uVar16 >> 0x18);
        soft_02.rawLen._2_2_ = uVar18;
        soft_02.info = pIVar12;
        semi_02.rawLen._0_2_ = in_stack_fffffffffffffa9c;
        semi_02.kind = (short)in_stack_fffffffffffffa98;
        semi_02._2_1_ = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
        semi_02.numFlags.raw = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
        semi_02.rawLen._2_2_ = in_stack_fffffffffffffa9e;
        semi_02.info._0_4_ = in_stack_fffffffffffffaa0;
        semi_02.info._4_4_ = in_stack_fffffffffffffaa4.m_bits;
        local_10 = slang::syntax::SyntaxFactory::expressionConstraint
                             ((SyntaxFactory *)in_stack_fffffffffffffa90,soft_02,
                              (ExpressionSyntax *)in_stack_fffffffffffffa88,semi_02);
      }
    }
    else {
      local_10 = (ExpressionConstraintSyntax *)0x0;
    }
  }
  else {
    local_10 = (ExpressionConstraintSyntax *)0x0;
  }
  return &local_10->super_ConstraintItemSyntax;
}

Assistant:

ConstraintItemSyntax* Parser::parseConstraintItem(bool allowBlock, bool isTopLevel) {
    switch (peek().kind) {
        case TokenKind::SolveKeyword: {
            auto solve = consume();
            if (!isTopLevel)
                addDiag(diag::SolveBeforeDisallowed, solve.range());

            Token before;
            SmallVector<TokenOrSyntax, 4> beforeBuffer;
            parseList<isPossibleExpressionOrComma, isBeforeOrSemicolon>(
                beforeBuffer, TokenKind::BeforeKeyword, TokenKind::Comma, before,
                RequireItems::True, diag::ExpectedExpression,
                [this] { return &parseExpression(); });

            Token semi;
            SmallVector<TokenOrSyntax, 4> afterBuffer;
            parseList<isPossibleExpressionOrComma, isSemicolon>(
                afterBuffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });

            return &factory.solveBeforeConstraint(solve, beforeBuffer.copy(alloc), before,
                                                  afterBuffer.copy(alloc), semi);
        }
        case TokenKind::DisableKeyword: {
            auto disable = consume();
            auto soft = expect(TokenKind::SoftKeyword);
            auto& name = parseExpression();
            return &factory.disableConstraint(disable, soft, name, expect(TokenKind::Semicolon));
        }
        case TokenKind::ForeachKeyword: {
            auto keyword = consume();
            auto& vars = parseForeachLoopVariables();
            return &factory.loopConstraint(keyword, vars, *parseConstraintItem(true, false));
        }
        case TokenKind::IfKeyword: {
            auto ifKeyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& constraints = *parseConstraintItem(true, false);

            ElseConstraintClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                elseClause = &factory.elseConstraintClause(elseKeyword,
                                                           *parseConstraintItem(true, false));
            }
            return &factory.conditionalConstraint(ifKeyword, openParen, condition, closeParen,
                                                  constraints, elseClause);
        }
        case TokenKind::UniqueKeyword: {
            auto keyword = consume();
            auto& list = parseRangeList();
            return &factory.uniquenessConstraint(keyword, list, expect(TokenKind::Semicolon));
        }
        case TokenKind::SoftKeyword: {
            auto soft = consume();
            auto& exprOrDist = parseExpressionOrDist();
            return &factory.expressionConstraint(soft, exprOrDist, expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenBrace: {
            // Ambiguity here: an open brace could either be the start of a constraint block
            // or the start of a concatenation expression. Descend into the expression until
            // we can find out for sure one way or the other.
            if (allowBlock) {
                uint32_t index = 1;
                if (peek(1).kind == TokenKind::CloseBrace ||
                    !scanTypePart<isNotInConcatenationExpr>(index, TokenKind::OpenBrace,
                                                            TokenKind::CloseBrace)) {
                    return &parseConstraintBlock(false);
                }
            }
            break;
        }
        default:
            break;
    }

    // If we reach this point we have some invalid syntax here. If we're in a nested
    // constraint block (identified by allowBlock == true) then we should make up
    // an item and return. This is accomplished by falling through to the parseSubExpression below.
    // Otherwise, this is the top level and we should return nullptr so that we skip over
    // the offending token.
    if (!isPossibleExpression(peek().kind) && !allowBlock)
        return nullptr;

    // at this point we either have an expression with optional distribution or
    // we have an implication constraint
    Token curr = peek();
    auto expr =
        &parseSubExpression(ExpressionOptions::ConstraintContext | ExpressionOptions::AllowDist, 0);
    if (!allowBlock && curr == peek())
        return nullptr;

    if (peek(TokenKind::MinusArrow)) {
        auto arrow = consume();
        return &factory.implicationConstraint(*expr, arrow, *parseConstraintItem(true, false));
    }

    return &factory.expressionConstraint(Token(), *expr, expect(TokenKind::Semicolon));
}